

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O2

void TTD::NSLogEvents::
     JsRTVarAndIntegralArgumentsAction_InternalUse_Emit<(TTD::NSLogEvents::EventKind)44,1ul,1ul>
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *pJVar1;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)44>
                     (evt);
  (*writer->_vptr_FileWriter[3])(writer,0x12,1);
  NSSnapValues::EmitTTDVar(pJVar1->Result,writer,NoSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  NSSnapValues::EmitTTDVar(pJVar1->VarArray[0],writer,NoSeparator);
  (*writer->_vptr_FileWriter[0xf])(writer,pJVar1->ScalarArray[0],1);
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void JsRTVarAndIntegralArgumentsAction_InternalUse_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>* vAction = GetInlineEventDataAs<JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>, tag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(vAction->Result, writer, NSTokens::Separator::NoSeparator);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(size_t i = 0; i < vcount; ++i)
            {
                NSSnapValues::EmitTTDVar(vAction->VarArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }

            for(size_t i = 0; i < icount; ++i)
            {
                writer->WriteNakedInt64(vAction->ScalarArray[i], vcount + i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();
        }